

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.cc
# Opt level: O0

void __thiscall draco::DecoderBuffer::DecoderBuffer(DecoderBuffer *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  BitDecoder::BitDecoder((BitDecoder *)(in_RDI + 3));
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined2 *)((long)in_RDI + 0x32) = 0;
  return;
}

Assistant:

DecoderBuffer::DecoderBuffer()
    : data_(nullptr),
      data_size_(0),
      pos_(0),
      bit_mode_(false),
      bitstream_version_(0) {}